

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bassignblk(bstring a,void *s,int len)

{
  int iVar1;
  int len_local;
  void *s_local;
  bstring a_local;
  
  if (((((a == (bstring)0x0) || (a->data == (uchar *)0x0)) || (a->mlen < a->slen)) ||
      ((a->slen < 0 || (a->mlen == 0)))) ||
     ((s == (void *)0x0 || ((len < 0 || (0x7ffffffe < len)))))) {
    a_local._4_4_ = -1;
  }
  else {
    if ((a->mlen < len + 1) && (iVar1 = balloc(a,len + 1), iVar1 < 0)) {
      return -1;
    }
    if (len != 0) {
      memmove(a->data,s,(long)len);
    }
    a->data[len] = '\0';
    a->slen = len;
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int bassignblk (bstring a, const void * s, int len) {
	if (a == NULL || a->data == NULL || a->mlen < a->slen ||
	    a->slen < 0 || a->mlen == 0 || NULL == s || len < 0 || len >= INT_MAX)
		return BSTR_ERR;
	if (len + 1 > a->mlen && 0 > balloc (a, len + 1)) return BSTR_ERR;
	bBlockCopy (a->data, s, (size_t) len);
	a->data[len] = (unsigned char) '\0';
	a->slen = len;
	return BSTR_OK;
}